

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItRandom<CyclicHash<unsigned_long_long,unsigned_char>>(uint L)

{
  int k;
  undefined1 *puVar1;
  long lVar2;
  ostream *poVar3;
  uint k_1;
  value_type *__val;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  CyclicHash<unsigned_long_long,_unsigned_char> hf;
  CyclicHash<unsigned_long_long,_unsigned_char> base;
  CyclicHash<unsigned_long_long,_unsigned_char> local_1080;
  CyclicHash<unsigned_long_long,_unsigned_char> local_858;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar1 = (undefined1 *)operator_new(5);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  lVar2 = 0;
  do {
    puVar1[lVar2] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash(&local_858,5,L);
  lVar2 = 0;
  uVar4 = 0;
  do {
    uVar4 = (uVar4 >> ((char)local_858.wordsize - 1U & 0x3f) | (uVar4 & local_858.mask1) * 2) ^
            local_858.hasher.hashvalues[(byte)puVar1[lVar2]];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  uVar5 = 0;
  bVar7 = true;
  do {
    CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash(&local_1080,5,L);
    lVar2 = 0;
    uVar6 = 0;
    do {
      uVar6 = (uVar6 >> ((char)local_1080.wordsize - 1U & 0x3f) | (uVar6 & local_1080.mask1) * 2) ^
              local_1080.hasher.hashvalues[(byte)puVar1[lVar2]];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    if (uVar6 == uVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
      poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      poVar3 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (uVar6 != uVar4) goto LAB_00106338;
    bVar7 = uVar5 < 99;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
LAB_00106338:
  operator_delete(puVar1);
  return bVar7;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}